

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O2

REF_STATUS ref_cavity_form_ball(REF_CAVITY ref_cavity,REF_GRID ref_grid,REF_INT node)

{
  int iVar1;
  REF_NODE ref_node;
  REF_CELL pRVar2;
  REF_ADJ pRVar3;
  REF_INT *pRVar4;
  REF_ADJ_ITEM pRVar5;
  uint uVar6;
  REF_STATUS RVar7;
  REF_INT *pRVar8;
  undefined8 uVar9;
  long lVar10;
  REF_INT RVar11;
  long lVar12;
  ulong uVar13;
  char *pcVar14;
  REF_BOOL all_local;
  REF_BOOL already_have_it;
  REF_INT seg_nodes [3];
  REF_INT face_nodes [3];
  
  ref_node = ref_grid->node;
  ref_cavity->ref_grid = ref_grid;
  ref_cavity->node = node;
  if (ref_node->ref_mpi->id == ref_node->part[node]) {
    if ((ref_grid->cell[9]->n < 1) && (ref_grid->cell[10]->n < 1)) {
      pRVar2 = ref_grid->cell[8];
      uVar13 = 0xffffffff;
      RVar11 = -1;
      if (-1 < node) {
        pRVar3 = pRVar2->ref_adj;
        uVar13 = 0xffffffff;
        RVar11 = -1;
        if (node < pRVar3->nnode) {
          uVar6 = pRVar3->first[node];
          uVar13 = 0xffffffff;
          RVar11 = -1;
          if ((long)(int)uVar6 != -1) {
            RVar11 = pRVar3->item[(int)uVar6].ref;
            uVar13 = (ulong)uVar6;
          }
        }
      }
      while ((int)uVar13 != -1) {
        uVar6 = ref_list_contains(ref_cavity->tet_list,RVar11,&already_have_it);
        if (uVar6 != 0) {
          pcVar14 = "have tet?";
          uVar9 = 0x339;
          goto LAB_001b5253;
        }
        if (already_have_it != 0) {
          pcVar14 = "added tet twice?";
          uVar9 = 0x33a;
          goto LAB_001b547e;
        }
        uVar6 = ref_list_push(ref_cavity->tet_list,RVar11);
        if (uVar6 != 0) {
          pcVar14 = "save tet";
          uVar9 = 0x33b;
          goto LAB_001b5253;
        }
        uVar6 = ref_cell_all_local(pRVar2,ref_node,RVar11,&all_local);
        if (uVar6 != 0) {
          pcVar14 = "local cell";
          uVar9 = 0x33c;
          goto LAB_001b5253;
        }
        if (all_local == 0) {
          ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
          return 0;
        }
        for (lVar10 = 0; lVar10 < pRVar2->face_per; lVar10 = lVar10 + 1) {
          pRVar8 = pRVar2->c2n;
          iVar1 = pRVar2->size_per;
          pRVar4 = pRVar2->f2n;
          for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
            face_nodes[lVar12] =
                 pRVar8[(long)pRVar4[(ulong)((uint)lVar10 & 0x3fffffff) * 4 + lVar12] +
                        (long)iVar1 * (long)RVar11];
          }
          if ((((face_nodes[0] != node) && (face_nodes[1] != node)) && (face_nodes[2] != node)) &&
             (uVar6 = ref_cavity_insert_face(ref_cavity,face_nodes), uVar6 != 0)) {
            pcVar14 = "tet side";
            uVar9 = 0x349;
            goto LAB_001b5253;
          }
        }
        pRVar5 = pRVar2->ref_adj->item;
        uVar13 = (ulong)pRVar5[(int)uVar13].next;
        RVar11 = -1;
        if (uVar13 != 0xffffffffffffffff) {
          RVar11 = pRVar5[uVar13].ref;
        }
      }
      pRVar2 = ref_grid->cell[3];
      uVar13 = 0xffffffff;
      RVar11 = -1;
      if (-1 < node) {
        pRVar3 = pRVar2->ref_adj;
        uVar13 = 0xffffffff;
        RVar11 = -1;
        if (node < pRVar3->nnode) {
          uVar6 = pRVar3->first[node];
          uVar13 = 0xffffffff;
          RVar11 = -1;
          if ((long)(int)uVar6 != -1) {
            RVar11 = pRVar3->item[(int)uVar6].ref;
            uVar13 = (ulong)uVar6;
          }
        }
      }
      do {
        if ((int)uVar13 == -1) {
          RVar7 = ref_cavity_verify_face_manifold(ref_cavity);
          if (RVar7 == 0) {
            RVar7 = ref_cavity_verify_seg_manifold(ref_cavity);
            if (RVar7 == 0) {
              return 0;
            }
            pcVar14 = "ball seg manifold";
            uVar6 = 1;
            uVar9 = 0x371;
          }
          else {
            pcVar14 = "ball face manifold";
            uVar6 = 1;
            uVar9 = 0x370;
          }
LAB_001b5253:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 uVar9,"ref_cavity_form_ball",(ulong)uVar6,pcVar14);
          return uVar6;
        }
        uVar6 = ref_list_contains(ref_cavity->tri_list,RVar11,&already_have_it);
        if (uVar6 != 0) {
          pcVar14 = "have tet?";
          uVar9 = 0x352;
          goto LAB_001b5253;
        }
        if (already_have_it != 0) {
          pcVar14 = "added tri twice?";
          uVar9 = 0x353;
LAB_001b547e:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 uVar9,"ref_cavity_form_ball",pcVar14);
          return 1;
        }
        uVar6 = ref_list_push(ref_cavity->tri_list,RVar11);
        if (uVar6 != 0) {
          pcVar14 = "save tri";
          uVar9 = 0x354;
          goto LAB_001b5253;
        }
        uVar6 = ref_cell_all_local(pRVar2,ref_node,RVar11,&all_local);
        if (uVar6 != 0) {
          pcVar14 = "local cell";
          uVar9 = 0x355;
          goto LAB_001b5253;
        }
        if (all_local == 0) goto LAB_001b5419;
        pRVar8 = pRVar2->c2n;
        lVar12 = (long)RVar11;
        lVar10 = pRVar2->size_per * lVar12;
        seg_nodes[2] = pRVar8[(long)(int)lVar10 + (long)pRVar2->node_per];
        seg_nodes[0] = pRVar8[lVar10 + 1];
        seg_nodes[1] = pRVar8[lVar10 + 2];
        if (seg_nodes[1] != node && seg_nodes[0] != node) {
          uVar6 = ref_cavity_insert_seg(ref_cavity,seg_nodes);
          if (uVar6 != 0) {
            pcVar14 = "tri side";
            uVar9 = 0x360;
            goto LAB_001b5253;
          }
          pRVar8 = pRVar2->c2n;
          lVar10 = pRVar2->size_per * lVar12;
        }
        seg_nodes[0] = pRVar8[lVar10 + 2];
        seg_nodes[1] = pRVar8[lVar10];
        if (seg_nodes[1] != node && seg_nodes[0] != node) {
          uVar6 = ref_cavity_insert_seg(ref_cavity,seg_nodes);
          if (uVar6 != 0) {
            pcVar14 = "tri side";
            uVar9 = 0x366;
            goto LAB_001b5253;
          }
          pRVar8 = pRVar2->c2n;
          lVar10 = pRVar2->size_per * lVar12;
        }
        seg_nodes[0] = pRVar8[lVar10];
        seg_nodes[1] = pRVar8[lVar10 + 1];
        if ((seg_nodes[1] != node && seg_nodes[0] != node) &&
           (uVar6 = ref_cavity_insert_seg(ref_cavity,seg_nodes), uVar6 != 0)) {
          pcVar14 = "tri side";
          uVar9 = 0x36c;
          goto LAB_001b5253;
        }
        pRVar5 = pRVar2->ref_adj->item;
        uVar13 = (ulong)pRVar5[(int)uVar13].next;
        RVar11 = -1;
        if (uVar13 != 0xffffffffffffffff) {
          RVar11 = pRVar5[uVar13].ref;
        }
      } while( true );
    }
    ref_cavity->state = REF_CAVITY_MANIFOLD_CONSTRAINED;
  }
  else {
LAB_001b5419:
    ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_form_ball(REF_CAVITY ref_cavity,
                                        REF_GRID ref_grid, REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell_face, face_node, cell;
  REF_BOOL has_node;
  REF_BOOL already_have_it, all_local;
  REF_INT face_nodes[3], seg_nodes[3];

  RSS(ref_cavity_form_empty(ref_cavity, ref_grid, node), "init form empty");
  if (!ref_node_owned(ref_node, node)) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
    return REF_SUCCESS;
  }

  /* mixed element protections are not mature */
  if (ref_cell_n(ref_grid_pyr(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_pri(ref_grid)) > 0) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_MANIFOLD_CONSTRAINED;
    return REF_SUCCESS;
  }

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    RAS(!already_have_it, "added tet twice?");
    RSS(ref_list_push(ref_cavity_tet_list(ref_cavity), cell), "save tet");
    RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local), "local cell");
    if (!all_local) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
      return REF_SUCCESS;
    }
    each_ref_cell_cell_face(ref_cell, cell_face) {
      each_ref_cavity_face_node(ref_cavity, face_node) {
        face_nodes[face_node] =
            ref_cell_f2n(ref_cell, face_node, cell_face, cell);
      }
      has_node = (node == face_nodes[0] || node == face_nodes[1] ||
                  node == face_nodes[2]);
      if (!has_node) {
        RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet side");
      }
    }
  }

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_list_contains(ref_cavity_tri_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    RAS(!already_have_it, "added tri twice?");
    RSS(ref_list_push(ref_cavity_tri_list(ref_cavity), cell), "save tri");
    RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local), "local cell");
    if (!all_local) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
      return REF_SUCCESS;
    }

    seg_nodes[2] = ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell);
    seg_nodes[0] = ref_cell_c2n(ref_cell, 1, cell);
    seg_nodes[1] = ref_cell_c2n(ref_cell, 2, cell);
    has_node = (node == seg_nodes[0] || node == seg_nodes[1]);
    if (!has_node) {
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    }
    seg_nodes[0] = ref_cell_c2n(ref_cell, 2, cell);
    seg_nodes[1] = ref_cell_c2n(ref_cell, 0, cell);
    has_node = (node == seg_nodes[0] || node == seg_nodes[1]);
    if (!has_node) {
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    }
    seg_nodes[0] = ref_cell_c2n(ref_cell, 0, cell);
    seg_nodes[1] = ref_cell_c2n(ref_cell, 1, cell);
    has_node = (node == seg_nodes[0] || node == seg_nodes[1]);
    if (!has_node) {
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    }
  }

  RSS(ref_cavity_verify_face_manifold(ref_cavity), "ball face manifold");
  RSS(ref_cavity_verify_seg_manifold(ref_cavity), "ball seg manifold");

  return REF_SUCCESS;
}